

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_3,_3> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::increment<float,3,3>
          (Matrix<float,_3,_3> *__return_storage_ptr__,MatrixCaseUtils *this,
          Matrix<float,_3,_3> *mat)

{
  Vector<float,_3> *pVVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Matrix<float,_3,_3> *pMVar4;
  int r;
  long lVar5;
  float *pfVar6;
  Matrix<float,_3,_3> *retVal;
  int row;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  bool bVar11;
  undefined4 uVar12;
  long lVar10;
  
  pMVar4 = __return_storage_ptr__;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[1] = 0.0;
  pVVar1[1].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((__return_storage_ptr__->m_data).m_data[0].m_data + 2) = 0;
  (__return_storage_ptr__->m_data).m_data[2].m_data[2] = 0.0;
  auVar3 = _DAT_019f34d0;
  auVar2 = _DAT_019ec5b0;
  lVar5 = 0;
  lVar7 = 0;
  pfVar6 = (float *)__return_storage_ptr__;
  do {
    lVar8 = 0;
    auVar9 = auVar3;
    do {
      bVar11 = SUB164(auVar9 ^ auVar2,4) == -0x80000000 && SUB164(auVar9 ^ auVar2,0) < -0x7ffffffd;
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar5 != lVar8) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar6 + lVar8) = uVar12;
      }
      if (bVar11) {
        uVar12 = 0x3f800000;
        if (lVar5 + -0xc != lVar8) {
          uVar12 = 0;
        }
        *(undefined4 *)((long)pfVar6 + lVar8 + 0xc) = uVar12;
      }
      lVar10 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar10 + 2;
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x30);
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 0xc;
    pfVar6 = pfVar6 + 1;
  } while (lVar7 != 3);
  lVar5 = 0;
  do {
    lVar7 = 0;
    do {
      *(float *)((long)__return_storage_ptr__ + lVar7) = *(float *)(this + lVar7) + 1.0;
      lVar7 = lVar7 + 0xc;
    } while (lVar7 != 0x24);
    lVar5 = lVar5 + 1;
    this = this + 4;
    __return_storage_ptr__ = (Matrix<float,_3,_3> *)((long)__return_storage_ptr__ + 4);
  } while (lVar5 != 3);
  return pMVar4;
}

Assistant:

tcu::Matrix<T, Rows, Cols> increment (const tcu::Matrix<T, Rows, Cols>& mat)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = mat(r, c) + 1.0f;

	return retVal;
}